

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operations.cpp
# Opt level: O0

bool boost::filesystem::detail::possible_large_file_size_support(void)

{
  stat lcl_stat;
  
  return true;
}

Assistant:

BOOST_FILESYSTEM_DECL bool possible_large_file_size_support()
  {
#   ifdef BOOST_POSIX_API
    struct stat lcl_stat;
    return sizeof(lcl_stat.st_size)> 4;
#   else
    return true;
#   endif
  }